

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaO_str2d(char *s,lua_Number *result)

{
  ulong uVar1;
  ushort **ppuVar2;
  double *in_RSI;
  byte *in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  char *endptr;
  byte *local_20;
  double *local_18;
  byte *local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  dVar3 = strtod((char *)in_RDI,(char **)&local_20);
  *local_18 = dVar3;
  if (local_20 == local_10) {
    local_4 = 0;
  }
  else {
    if ((*local_20 == 0x78) || (*local_20 == 0x58)) {
      uVar1 = strtoul((char *)local_10,(char **)&local_20,0x10);
      auVar4._8_4_ = (int)(uVar1 >> 0x20);
      auVar4._0_8_ = uVar1;
      auVar4._12_4_ = 0x45300000;
      *local_18 = (auVar4._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    }
    if (*local_20 == 0) {
      local_4 = 1;
    }
    else {
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)*local_20] & 0x2000) != 0) {
        local_20 = local_20 + 1;
      }
      if (*local_20 == 0) {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int luaO_str2d(const char*s,lua_Number*result){
char*endptr;
*result=lua_str2number(s,&endptr);
if(endptr==s)return 0;
if(*endptr=='x'||*endptr=='X')
*result=cast_num(strtoul(s,&endptr,16));
if(*endptr=='\0')return 1;
while(isspace(cast(unsigned char,*endptr)))endptr++;
if(*endptr!='\0')return 0;
return 1;
}